

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

uint8_t * __thiscall
CoreML::Specification::BiDirectionalLSTMLayerParams::_InternalSerialize
          (BiDirectionalLSTMLayerParams *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  int iVar1;
  uint uVar2;
  LSTMParams *this_00;
  void *data;
  bool bVar3;
  uint8_t *puVar4;
  Type *pTVar5;
  ulong uVar6;
  Type *this_01;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  undefined8 *puVar10;
  size_t __n;
  
  if (this->inputvectorsize_ != 0) {
    puVar4 = target;
    if (stream->end_ <= target) {
      puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar7 = this->inputvectorsize_;
    *puVar4 = '\b';
    puVar4[1] = (byte)uVar7;
    if (uVar7 < 0x80) {
      target = puVar4 + 2;
    }
    else {
      puVar4[1] = (byte)uVar7 | 0x80;
      puVar4[2] = (uint8_t)(uVar7 >> 7);
      target = puVar4 + 3;
      if (0x3fff < uVar7) {
        uVar8 = (ulong)puVar4[2];
        uVar7 = uVar7 >> 7;
        do {
          target[-1] = (byte)uVar8 | 0x80;
          uVar6 = uVar7 >> 7;
          *target = (uint8_t)uVar6;
          target = target + 1;
          uVar8 = uVar6 & 0xffffffff;
          bVar3 = 0x3fff < uVar7;
          uVar7 = uVar6;
        } while (bVar3);
      }
    }
  }
  puVar4 = target;
  if (this->outputvectorsize_ != 0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar7 = this->outputvectorsize_;
    *target = '\x10';
    target[1] = (byte)uVar7;
    if (uVar7 < 0x80) {
      puVar4 = target + 2;
    }
    else {
      target[1] = (byte)uVar7 | 0x80;
      target[2] = (uint8_t)(uVar7 >> 7);
      puVar4 = target + 3;
      if (0x3fff < uVar7) {
        uVar8 = (ulong)target[2];
        uVar7 = uVar7 >> 7;
        do {
          puVar4[-1] = (byte)uVar8 | 0x80;
          uVar6 = uVar7 >> 7;
          *puVar4 = (uint8_t)uVar6;
          puVar4 = puVar4 + 1;
          uVar8 = uVar6 & 0xffffffff;
          bVar3 = 0x3fff < uVar7;
          uVar7 = uVar6;
        } while (bVar3);
      }
    }
  }
  iVar1 = (this->activationsforwardlstm_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar1 != 0) {
    iVar9 = 0;
    do {
      if (stream->end_ <= puVar4) {
        puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar4);
      }
      pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<CoreML::Specification::ActivationParams>::TypeHandler>
                         (&(this->activationsforwardlstm_).super_RepeatedPtrFieldBase,iVar9);
      *puVar4 = 'R';
      uVar2 = (pTVar5->_cached_size_).size_.super___atomic_base<int>._M_i;
      puVar4[1] = (uint8_t)uVar2;
      if (uVar2 < 0x80) {
        puVar4 = puVar4 + 2;
      }
      else {
        puVar4 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper
                           (uVar2,puVar4 + 1);
      }
      puVar4 = ActivationParams::_InternalSerialize(pTVar5,puVar4,stream);
      iVar9 = iVar9 + 1;
    } while (iVar1 != iVar9);
  }
  iVar1 = (this->activationsbackwardlstm_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar1 != 0) {
    iVar9 = 0;
    do {
      if (stream->end_ <= puVar4) {
        puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar4);
      }
      pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<CoreML::Specification::ActivationParams>::TypeHandler>
                         (&(this->activationsbackwardlstm_).super_RepeatedPtrFieldBase,iVar9);
      *puVar4 = 'Z';
      uVar2 = (pTVar5->_cached_size_).size_.super___atomic_base<int>._M_i;
      puVar4[1] = (uint8_t)uVar2;
      if (uVar2 < 0x80) {
        puVar4 = puVar4 + 2;
      }
      else {
        puVar4 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper
                           (uVar2,puVar4 + 1);
      }
      puVar4 = ActivationParams::_InternalSerialize(pTVar5,puVar4,stream);
      iVar9 = iVar9 + 1;
    } while (iVar1 != iVar9);
  }
  if ((this != (BiDirectionalLSTMLayerParams *)_BiDirectionalLSTMLayerParams_default_instance_) &&
     (this->params_ != (LSTMParams *)0x0)) {
    if (stream->end_ <= puVar4) {
      puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar4);
    }
    this_00 = this->params_;
    *puVar4 = 'z';
    uVar2 = (this_00->_cached_size_).size_.super___atomic_base<int>._M_i;
    puVar4[1] = (uint8_t)uVar2;
    if (uVar2 < 0x80) {
      puVar4 = puVar4 + 2;
    }
    else {
      puVar4 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper
                         (uVar2,puVar4 + 1);
    }
    puVar4 = LSTMParams::_InternalSerialize(this_00,puVar4,stream);
  }
  iVar1 = (this->weightparams_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar1 != 0) {
    iVar9 = 0;
    do {
      if (stream->end_ <= puVar4) {
        puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar4);
      }
      this_01 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<CoreML::Specification::LSTMWeightParams>::TypeHandler>
                          (&(this->weightparams_).super_RepeatedPtrFieldBase,iVar9);
      puVar4[0] = 0xa2;
      puVar4[1] = '\x01';
      uVar2 = (this_01->_cached_size_).size_.super___atomic_base<int>._M_i;
      puVar4[2] = (uint8_t)uVar2;
      if (uVar2 < 0x80) {
        puVar4 = puVar4 + 3;
      }
      else {
        puVar4 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper
                           (uVar2,puVar4 + 2);
      }
      puVar4 = LSTMWeightParams::_InternalSerialize(this_01,puVar4,stream);
      iVar9 = iVar9 + 1;
    } while (iVar1 != iVar9);
  }
  uVar7 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar7 & 1) != 0) {
    data = *(void **)((uVar7 & 0xfffffffffffffffc) + 8);
    uVar7 = (this->super_MessageLite)._internal_metadata_.ptr_;
    if ((uVar7 & 1) == 0) {
      puVar10 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
      if ((google::protobuf::internal::init_protobuf_defaults_state & 1) == 0) {
        google::protobuf::internal::InitProtobufDefaultsSlow();
      }
    }
    else {
      puVar10 = (undefined8 *)((uVar7 & 0xfffffffffffffffc) + 8);
    }
    __n = (size_t)(int)puVar10[1];
    if ((long)stream->end_ - (long)puVar4 < (long)__n) {
      puVar4 = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback
                         (stream,data,(int)puVar10[1],puVar4);
      return puVar4;
    }
    memcpy(puVar4,data,__n);
    puVar4 = puVar4 + __n;
  }
  return puVar4;
}

Assistant:

uint8_t* BiDirectionalLSTMLayerParams::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.BiDirectionalLSTMLayerParams)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // uint64 inputVectorSize = 1;
  if (this->_internal_inputvectorsize() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteUInt64ToArray(1, this->_internal_inputvectorsize(), target);
  }

  // uint64 outputVectorSize = 2;
  if (this->_internal_outputvectorsize() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteUInt64ToArray(2, this->_internal_outputvectorsize(), target);
  }

  // repeated .CoreML.Specification.ActivationParams activationsForwardLSTM = 10;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_activationsforwardlstm_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(10, this->_internal_activationsforwardlstm(i), target, stream);
  }

  // repeated .CoreML.Specification.ActivationParams activationsBackwardLSTM = 11;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_activationsbackwardlstm_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(11, this->_internal_activationsbackwardlstm(i), target, stream);
  }

  // .CoreML.Specification.LSTMParams params = 15;
  if (this->_internal_has_params()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        15, _Internal::params(this), target, stream);
  }

  // repeated .CoreML.Specification.LSTMWeightParams weightParams = 20;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_weightparams_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(20, this->_internal_weightparams(i), target, stream);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.BiDirectionalLSTMLayerParams)
  return target;
}